

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::assign_impl
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,size_type count,int *value)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  int *piVar4;
  
  piVar2 = choose_data(this,count);
  this->m_end = piVar2;
  this->m_begin = piVar2;
  if (count != 0) {
    iVar1 = *value;
    piVar4 = piVar2;
    do {
      *piVar4 = iVar1;
      piVar4 = piVar4 + 1;
      count = count - 1;
    } while (count != 0);
    this->m_end = piVar4;
  }
  sVar3 = 4;
  if ((type *)piVar2 != this->m_static_data) {
    sVar3 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar3;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }